

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void print_hex(char *name,uchar *s,int slen)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *out;
  int i;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  while( true ) {
    sVar2 = strlen(name);
    if (sVar2 <= uVar3) break;
    putchar((int)name[uVar3]);
    uVar3 = uVar3 + 1;
  }
  uVar1 = slen * 2;
  out = (uint8_t *)malloc((long)(int)uVar1);
  u8_to_hex(s,slen,out);
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    putchar((uint)out[uVar3]);
  }
  putchar(10);
  free(out);
  return;
}

Assistant:

void print_hex(const char *name, unsigned char *s, int slen)
{
    for(int i = 0; i < strlen(name); i++)
        printf("%c", name[i]);
    unsigned char *hex = (unsigned char*)malloc(2*slen);
    u8_to_hex(s, slen, hex);
    for(int i = 0; i < 2*slen; i++)
        printf("%c", hex[i]);
    printf("\n");
    free(hex);
}